

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_3,_2>,_tcu::Matrix<double,_2,_3>_>::call
          (unary<tcu::Matrix<double,_3,_2>,_tcu::Matrix<double,_2,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  Matrix<double,_3,_2> local_c8;
  code *local_98;
  functionPointer p_function;
  undefined1 local_80 [8];
  Matrix<double,_2,_3> arg;
  Matrix<double,_3,_2> result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<tcu::Matrix<double,_3,_2>,_tcu::Matrix<double,_2,_3>_> *this_local;
  
  tcu::Matrix<double,_3,_2>::Matrix((Matrix<double,_3,_2> *)(arg.m_data.m_data[2].m_data + 1));
  tcu::Matrix<double,_2,_3>::Matrix((Matrix<double,_2,_3> *)local_80);
  unpack<tcu::Matrix<double,_2,_3>_>::get(argument_src,(Matrix<double,_2,_3> *)local_80);
  local_98 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  (*local_98)(&local_c8,local_80);
  tcu::Matrix<double,_3,_2>::operator=
            ((Matrix<double,_3,_2> *)(arg.m_data.m_data[2].m_data + 1),&local_c8);
  tcu::Matrix<double,_3,_2>::~Matrix(&local_c8);
  pack<tcu::Matrix<double,_3,_2>_>::set
            (result_dst,(Matrix<double,_3,_2> *)(arg.m_data.m_data[2].m_data + 1));
  tcu::Matrix<double,_2,_3>::~Matrix((Matrix<double,_2,_3> *)local_80);
  tcu::Matrix<double,_3,_2>::~Matrix((Matrix<double,_3,_2> *)(arg.m_data.m_data[2].m_data + 1));
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}